

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall Assimp::FIDoubleValueImpl::toString_abi_cxx11_(FIDoubleValueImpl *this)

{
  anon_class_16_2_7fa2732d __f;
  vector<double,_std::allocator<double>_> *this_00;
  string local_1f0 [32];
  anon_class_16_2_7fa2732d local_1d0;
  int *local_1b0;
  ostringstream *local_1a8;
  double *local_1a0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_198;
  int local_18c;
  ostringstream local_188 [4];
  int n;
  ostringstream os;
  FIDoubleValueImpl *this_local;
  
  if ((this->strValueValid & 1U) == 0) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_188);
    local_18c = 0;
    this_00 = &(this->super_FIDoubleValue).value;
    local_198._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this_00);
    local_1a0 = (double *)std::vector<double,_std::allocator<double>_>::end(this_00);
    local_1b0 = &local_18c;
    __f.os = (ostringstream *)local_188;
    __f.n = local_1b0;
    local_1a8 = local_188;
    local_1d0 = std::
                for_each<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,Assimp::FIDoubleValueImpl::toString[abi:cxx11]()const::_lambda(double)_1_>
                          (local_198,
                           (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                            )local_1a0,__f);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->strValue,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            int n = 0;
            std::for_each(value.begin(), value.end(), [&](double d) { if (++n > 1) os << ' '; os << d; });
            strValue = os.str();
        }
        return strValue;
    }